

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestMutualRecursionA_SubGroup::Clear(TestMutualRecursionA_SubGroup *this)

{
  TestMutualRecursionA_SubMessage *this_00;
  TestAllTypes *this_01;
  char *pcVar1;
  anon_union_24_1_493b367e_for_TestMutualRecursionA_SubGroup_3 aVar2;
  int line;
  LogMessageFatal local_20;
  
  aVar2 = this->field_0;
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x3) != (undefined1  [24])0x0) {
    if (((undefined1  [24])aVar2 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
      this_00 = (this->field_0)._impl_.sub_message_;
      if (this_00 == (TestMutualRecursionA_SubMessage *)0x0) {
        pcVar1 = "from._impl_.sub_message_ != nullptr";
        line = 0x5872;
        goto LAB_00c95c6a;
      }
      TestMutualRecursionA_SubMessage::Clear(this_00);
    }
    if (((undefined1  [24])aVar2 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
      this_01 = (this->field_0)._impl_.not_in_this_scc_;
      if (this_01 == (TestAllTypes *)0x0) {
        pcVar1 = "from._impl_.not_in_this_scc_ != nullptr";
        line = 0x5876;
LAB_00c95c6a:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest.pb.cc"
                   ,line,pcVar1 + 5);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      TestAllTypes::Clear(this_01);
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestMutualRecursionA_SubGroup::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestMutualRecursionA.SubGroup)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.sub_message_ != nullptr);
      _impl_.sub_message_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.not_in_this_scc_ != nullptr);
      _impl_.not_in_this_scc_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}